

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall
helics::SmallBuffer::SmallBuffer<std::__cxx11::string,void>
          (SmallBuffer *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  pointer pvVar1;
  const_pointer __src;
  size_type __n;
  undefined1 *in_RDI;
  string_view val;
  SmallBuffer *in_stack_ffffffffffffffd0;
  void *__dest;
  __sv_type local_20 [2];
  
  memset(in_RDI,0,0x40);
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0x40;
  pvVar1 = CLI::std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x32ac2f);
  *(pointer *)(in_RDI + 0x50) = pvVar1;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  local_20[0] = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffffd0);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_20);
  resize(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  __dest = *(void **)(in_RDI + 0x50);
  __src = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(local_20);
  __n = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_20);
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

SmallBuffer(U&& u): heap(buffer.data())
    {
        std::string_view val(std::forward<U>(u));
        resize(val.size());
        std::memcpy(heap, val.data(), val.size());
    }